

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

int Gia_ManDupConeBackObjs(Gia_Man_t *p,Gia_Man_t *pNew,Vec_Int_t *vObjs)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  int *piVar3;
  long lVar4;
  long lVar5;
  
  if (pNew->vCis->nSize != vObjs->nSize) {
    __assert_fail("Gia_ManCiNum(pNew) == Vec_IntSize(vObjs)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0x7ee,"int Gia_ManDupConeBackObjs(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *)");
  }
  Gia_ManFillValue(pNew);
  pGVar2 = pNew->pObjs;
  pGVar2->Value = 0;
  lVar4 = (long)pNew->vCis->nSize;
  if (0 < lVar4) {
    piVar3 = pNew->vCis->pArray;
    lVar5 = 0;
    do {
      iVar1 = piVar3[lVar5];
      if (((long)iVar1 < 0) || (pNew->nObjs <= iVar1)) goto LAB_001e428d;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      if (vObjs->nSize <= lVar5) goto LAB_001e42ac;
      if (vObjs->pArray[lVar5] < 0) {
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12e,"int Abc_Var2Lit(int, int)");
      }
      pGVar2[iVar1].Value = vObjs->pArray[lVar5] * 2;
      lVar5 = lVar5 + 1;
    } while (lVar4 != lVar5);
  }
  if (pNew->vCos->nSize < 1) {
LAB_001e42ac:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar1 = *pNew->vCos->pArray;
  if ((-1 < (long)iVar1) && (iVar1 < pNew->nObjs)) {
    pGVar2 = pGVar2 + iVar1;
    Gia_ManDupConeBack_rec(p,pNew,pGVar2 + -(*(ulong *)pGVar2 & 0x1fffffff));
    if (-1 < (int)pGVar2[-(*(ulong *)pGVar2 & 0x1fffffff)].Value) {
      return (uint)(*(ulong *)pGVar2 >> 0x1d) & 1 ^ pGVar2[-(*(ulong *)pGVar2 & 0x1fffffff)].Value;
    }
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x132,"int Abc_LitNotCond(int, int)");
  }
LAB_001e428d:
  __assert_fail("v >= 0 && v < p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
}

Assistant:

int Gia_ManDupConeBackObjs( Gia_Man_t * p, Gia_Man_t * pNew, Vec_Int_t * vObjs )
{
    Gia_Obj_t * pObj, * pRoot; int i;
    assert( Gia_ManCiNum(pNew) == Vec_IntSize(vObjs) );
    Gia_ManFillValue(pNew);
    Gia_ManConst0(pNew)->Value = 0;
    Gia_ManForEachCi( pNew, pObj, i )
        pObj->Value = Abc_Var2Lit( Vec_IntEntry(vObjs, i), 0 );
    pRoot = Gia_ManCo(pNew, 0);
    Gia_ManDupConeBack_rec( p, pNew, Gia_ObjFanin0(pRoot) );
    return Gia_ObjFanin0Copy(pRoot);
}